

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::process(BinBinaryWriter *this,Bin *bin)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer pcVar2;
  bool bVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->error);
  pvVar1 = (this->writer).buffer_;
  pcVar2 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  bVar3 = write_sections(this,bin);
  if (bVar3) {
    return true;
  }
  bVar3 = fail_msg(this,"write_sections(bin)\n");
  return bVar3;
}

Assistant:

bool process(Bin const& bin) noexcept {
            error.clear();
            writer.buffer_.clear();
            bin_assert(write_sections(bin));
            return true;
        }